

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_format.hpp
# Opt level: O1

string_t *
cfgfile::to_cfgfile_format<cfgfile::string_trait_t>(string_t *__return_storage_ptr__,string_t *what)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  char cVar5;
  size_type sVar6;
  long *local_78;
  long local_70;
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  if (what->_M_string_length == 0) {
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"\"\"","");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_78,local_70 + (long)local_78);
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
  }
  else {
    cVar5 = (char)what;
    lVar4 = std::__cxx11::string::find
                      (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_begin_tag);
    if ((((((lVar4 == -1) &&
           (lVar4 = std::__cxx11::string::find
                              (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_end_tag),
           lVar4 == -1)) &&
          (lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_quotes),
          lVar4 == -1)) &&
         ((lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::
                                                      c_carriage_return), lVar4 == -1 &&
          (lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_line_feed)
          , lVar4 == -1)))) &&
        ((lVar4 = std::__cxx11::string::find
                            (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_tab),
         lVar4 == -1 &&
         ((lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_back_slash
                             ), lVar4 == -1 &&
          (lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_space),
          lVar4 == -1)))))) &&
       ((lVar4 = std::__cxx11::string::find
                           ((char *)what,
                            const_t<cfgfile::string_trait_t>::c_one_line_comment_abi_cxx11_,0),
        lVar4 == -1 &&
        ((lVar4 = std::__cxx11::string::find
                            ((char *)what,
                             const_t<cfgfile::string_trait_t>::c_start_multi_line_comment_abi_cxx11_
                             ,0), lVar4 == -1 &&
         (lVar4 = std::__cxx11::string::find
                            ((char *)what,
                             const_t<cfgfile::string_trait_t>::
                             c_finish_multi_line_comment_abi_cxx11_,0), lVar4 == -1)))))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (what->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + what->_M_string_length);
    }
    else {
      local_38 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      cVar5 = (char)__return_storage_ptr__;
      std::__cxx11::string::push_back(cVar5);
      sVar2 = what->_M_string_length;
      if (sVar2 != 0) {
        pcVar3 = (what->_M_dataplus)._M_p;
        sVar6 = 0;
        do {
          cVar1 = pcVar3[sVar6];
          if (cVar1 == const_t<cfgfile::string_trait_t>::c_quotes) {
            local_58 = local_48;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\\\"","");
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,local_58,local_50 + (long)local_58);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
LAB_00103ed8:
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
            if (local_58 != local_48) {
              operator_delete(local_58,local_48[0] + 1);
            }
          }
          else {
            if (cVar1 == const_t<cfgfile::string_trait_t>::c_carriage_return) {
              local_58 = local_48;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\\n","");
              local_78 = local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_78,local_58,local_50 + (long)local_58);
              std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
              goto LAB_00103ed8;
            }
            if (cVar1 == const_t<cfgfile::string_trait_t>::c_line_feed) {
              local_58 = local_48;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\\r","");
              local_78 = local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_78,local_58,local_50 + (long)local_58);
              std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
              goto LAB_00103ed8;
            }
            if (cVar1 == const_t<cfgfile::string_trait_t>::c_tab) {
              local_58 = local_48;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\\t","");
              local_78 = local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_78,local_58,local_50 + (long)local_58);
              std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
              goto LAB_00103ed8;
            }
            if (cVar1 == const_t<cfgfile::string_trait_t>::c_back_slash) {
              local_58 = local_48;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\\\\","");
              local_78 = local_68;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_78,local_58,local_50 + (long)local_58);
              std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
              goto LAB_00103ed8;
            }
            std::__cxx11::string::push_back(cVar5);
          }
          sVar6 = sVar6 + 1;
        } while (sVar2 != sVar6);
      }
      std::__cxx11::string::push_back(cVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static inline typename Trait::string_t to_cfgfile_format(
	const typename Trait::string_t & what )
{
	if( what.empty() )
		return Trait::from_ascii( "\"\"" );

	if( what.find( const_t< Trait >::c_begin_tag ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_end_tag ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_quotes ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_carriage_return ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_line_feed ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_tab )  == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_back_slash ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_space ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_one_line_comment ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_start_multi_line_comment ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_finish_multi_line_comment ) == Trait::string_t::npos )
			return what;
	else
	{
		typename Trait::string_t result;

		result.push_back( const_t< Trait >::c_quotes );

		for( const typename Trait::char_t & ch : what )
		{
			if( ch == const_t< Trait >::c_quotes )
				result.append( Trait::from_ascii( "\\\"" ) );
			else if( ch == const_t< Trait >::c_carriage_return )
				result.append( Trait::from_ascii( "\\n" ) );
			else if( ch == const_t< Trait >::c_line_feed )
				result.append( Trait::from_ascii( "\\r" ) );
			else if( ch == const_t< Trait >::c_tab )
				result.append( Trait::from_ascii( "\\t" ) );
			else if( ch == const_t< Trait >::c_back_slash )
				result.append( Trait::from_ascii( "\\\\" ) );
			else
				result.push_back( ch );
		}

		result.push_back( const_t< Trait >::c_quotes );

		return result;
	}
}